

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v9::detail::write_escaped_string<char,fmt::v9::appender>
                   (appender out,basic_string_view<char> str)

{
  char *in_RCX;
  detail *this;
  detail *begin;
  find_escape_result<char> escape;
  find_escape_result<char> local_38;
  
  this = (detail *)str.data_;
  local_38.begin._0_1_ = 0x22;
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
             (char *)&local_38);
  begin = this + str.size_;
  do {
    find_escape(&local_38,this,(char *)begin,in_RCX);
    buffer<char>::append<char>
              ((buffer<char> *)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,(char *)this
               ,(char *)CONCAT71(local_38.begin._1_7_,local_38.begin._0_1_));
    this = (detail *)local_38.end;
    if ((detail *)local_38.end == (detail *)0x0) break;
    out = write_escaped_cp<fmt::v9::appender,char>(out,&local_38);
  } while (this != begin);
  local_38.begin._0_1_ = 0x22;
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
             (char *)&local_38);
  return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy_str<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}